

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRuntimeFail.cpp
# Opt level: O2

void __thiscall Test_testGlobalOverflow::Run(Test_testGlobalOverflow *this)

{
  nullres nVar1;
  int iVar2;
  char *pcVar3;
  char buf [512];
  
  nullcClean();
  nullcSetExecutorStackSize(0x8000);
  if (Tests::messageVerbose == '\x01') {
    puts("Global overflow test\r");
  }
  if (DAT_003e6490 == '\x01') {
    testsCount[1] = testsCount[1] + 1;
    nullcSetExecutor(1);
    nVar1 = nullcBuild(testGlobalOverflow);
    if (nVar1 == '\0') {
      __assert_fail("good",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestRuntimeFail.cpp"
                    ,0x220,"virtual void Test_testGlobalOverflow::Run()");
    }
    nVar1 = nullcRun();
    if (nVar1 == '\0') {
      pcVar3 = nullcGetLastError();
      pcVar3 = strstr(pcVar3,"ERROR:");
      if (pcVar3 == (char *)0x0) {
        pcVar3 = nullcGetLastError();
      }
      strncpy(buf,pcVar3,0x1ff);
      buf[0x1ff] = '\0';
      pcVar3 = strchr(buf,0xd);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      iVar2 = bcmp("ERROR: allocated stack overflow",buf,0x20);
      if (iVar2 == 0) {
        testsPassed[1] = testsPassed[1] + 1;
      }
      else {
        if (Tests::messageVerbose == '\0') {
          puts("Global overflow test\r");
        }
        printf("X86 failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n",buf,
               "ERROR: allocated stack overflow");
      }
    }
    else {
      if (Tests::messageVerbose == '\0') {
        puts("Global overflow test\r");
      }
      puts("Test should have failed.\r");
    }
  }
  nullcClean();
  nullcSetExecutorStackSize(Tests::testStackSize);
  return;
}

Assistant:

virtual void Run()
	{
		nullcClean();
		nullcSetExecutorStackSize(32 * 1024);

		if(Tests::messageVerbose)
			printf("Global overflow test\r\n");

		if(Tests::testFailureExecutor[TEST_TYPE_X86])
		{
			testsCount[TEST_TYPE_X86]++;
			nullcSetExecutor(NULLC_X86);
			nullres good = nullcBuild(testGlobalOverflow);
			assert(good);
			good = nullcRun();
			if(!good)
			{
				const char *expected = "ERROR: allocated stack overflow";
				char buf[512];

				if(const char *pos = strstr(nullcGetLastError(), "ERROR:"))
					strncpy(buf, pos, 511);
				else
					strncpy(buf, nullcGetLastError(), 511);

				buf[511] = 0;

				if(char *lineEnd = strchr(buf, '\r'))
					*lineEnd = 0;
				if(strcmp(expected, buf) != 0)
				{
					if(!Tests::messageVerbose)
						printf("Global overflow test\r\n");
					printf("X86 failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", buf, expected);
				}else{
					testsPassed[TEST_TYPE_X86]++;
				}
			}else{
				if(!Tests::messageVerbose)
					printf("Global overflow test\r\n");
				printf("Test should have failed.\r\n");
			}
		}

		nullcClean();
		nullcSetExecutorStackSize(Tests::testStackSize);
	}